

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBoxPrivateContainer::updateStyleSettings(QComboBoxPrivateContainer *this)

{
  long lVar1;
  int iVar2;
  QStyle *pQVar3;
  QFrame *in_RDI;
  long in_FS_OFFSET;
  QStyleOptionComboBox opt;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  QWidget *in_stack_ffffffffffffff40;
  QStyleOptionComboBox *this_00;
  int style;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  QComboBoxPrivateContainer *in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&stack0xffffffffffffff68,0xaa,0x90);
  comboStyleOption((QComboBoxPrivateContainer *)
                   CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  style = (int)((ulong)*(undefined8 *)&in_RDI[2].super_QWidget >> 0x20);
  pQVar3 = QWidget::style((QWidget *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))
                    (pQVar3,0x13,&stack0xffffffffffffff68,in_RDI[1].super_QWidget.data,0);
  if (iVar2 == 0) {
    pQVar3 = QWidget::style((QWidget *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38)
                           );
    (**(code **)(*(long *)pQVar3 + 0xf0))
              (pQVar3,0x19,&stack0xffffffffffffff68,in_RDI[1].super_QWidget.data,0);
  }
  QWidget::setMouseTracking(in_stack_ffffffffffffff40,(bool)in_stack_ffffffffffffff3f);
  pQVar3 = QWidget::style((QWidget *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  this_00 = (QStyleOptionComboBox *)&stack0xffffffffffffff68;
  (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x45,this_00,in_RDI[1].super_QWidget.data,0);
  QFrame::setFrameStyle(in_RDI,style);
  updateTopBottomMargin(in_stack_ffffffffffffff68);
  QStyleOptionComboBox::~QStyleOptionComboBox(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivateContainer::updateStyleSettings()
{
    // add scroller arrows if style needs them
    QStyleOptionComboBox opt = comboStyleOption();
    view->setMouseTracking(combo->style()->styleHint(QStyle::SH_ComboBox_ListMouseTracking, &opt, combo) ||
                           combo->style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, combo));
    setFrameStyle(combo->style()->styleHint(QStyle::SH_ComboBox_PopupFrameStyle, &opt, combo));
    updateTopBottomMargin();
}